

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Statement * __thiscall soul::StructuralParser::getNoop(StructuralParser *this)

{
  Statement *pSVar1;
  NoopStatement *pNVar2;
  Context local_28;
  
  if ((this->noop).object == (NoopStatement *)0x0) {
    local_28.location.sourceCode.object = (SourceCodeText *)0x0;
    local_28.location.location.data = (char *)0x0;
    local_28.parentScope = (Scope *)0x0;
    pNVar2 = PoolAllocator::allocate<soul::AST::NoopStatement,soul::AST::Context>
                       (&this->allocator->pool,&local_28);
    (this->noop).object = pNVar2;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.location.sourceCode.object);
  }
  pSVar1 = &((this->noop).object)->super_Statement;
  if (pSVar1 != (Statement *)0x0) {
    return pSVar1;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

AST::Statement& getNoop()     { if (noop == nullptr) noop = allocate<AST::NoopStatement> (AST::Context()); return *noop; }